

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManCountChoiceNodes(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int v;
  
  iVar3 = 0;
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (iVar3 = 0, p->pNexts != (int *)0x0)) {
    iVar3 = 0;
    for (v = 0; v < p->nObjs; v = v + 1) {
      pGVar2 = Gia_ManObj(p,v);
      if (pGVar2 == (Gia_Obj_t *)0x0) {
        return iVar3;
      }
      iVar1 = Gia_ObjIsHead(p,v);
      iVar3 = iVar3 + iVar1;
    }
  }
  return iVar3;
}

Assistant:

int Gia_ManCountChoiceNodes( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pReprs == NULL || p->pNexts == NULL )
        return 0;
    Gia_ManForEachObj( p, pObj, i )
        Counter += Gia_ObjIsHead( p, i );
    return Counter;
}